

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample01.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  ostream *poVar3;
  object *object;
  object *object_00;
  undefined1 auVar4 [16];
  dict local;
  handle local_220;
  dict global;
  object local_208;
  object local_200;
  object local_1f8;
  dict_iterator it;
  object local_1d0;
  object local_1c8;
  object local_1c0;
  object local_1b8;
  object local_1b0;
  object local_1a8;
  object local_1a0;
  object local_198;
  object local_190;
  object local_188;
  object local_180;
  object local_178;
  object local_170;
  object local_168;
  object local_160;
  object local_158;
  object local_150;
  object local_148;
  object local_140;
  object local_138;
  object local_130;
  object local_128;
  object local_120;
  object local_118;
  item_accessor func_01;
  object result;
  item_accessor func_02;
  item_accessor func_03;
  object local_90;
  object local_88;
  object local_80;
  object local_78;
  object local_70;
  object local_68;
  object local_60;
  object local_58;
  object local_50;
  object local_48;
  object local_40;
  object local_38;
  
  lVar2 = Py_DecodeLocale(*argv,0);
  if (lVar2 != 0) {
    Py_SetProgramName(lVar2);
    Py_Initialize();
    pybind11::module::import((module *)&func_03,"__main__");
    func_01.key.super_handle.m_ptr = (handle)anon_var_dwarf_e0cf;
    func_01.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    pybind11::detail::accessor::operator_cast_to_object((accessor *)&func_02);
    pybind11::dict::dict(&global,(object *)&func_02);
    pybind11::object::~object((object *)&func_02);
    pybind11::object::~object(&func_01.cache);
    pybind11::object::~object((object *)&func_03);
    pybind11::dict::dict(&local);
    pybind11::str::str((str *)&local_118,"from time import time,ctime");
    local_120.super_handle.m_ptr = (handle)(handle)global.super_object.super_handle.m_ptr;
    if ((handle)global.super_object.super_handle.m_ptr != (handle)0x0) {
      *(long *)global.super_object.super_handle.m_ptr =
           *(long *)global.super_object.super_handle.m_ptr + 1;
    }
    local_128.super_handle.m_ptr = (handle)(handle)local.super_object.super_handle.m_ptr;
    if ((handle)local.super_object.super_handle.m_ptr != (handle)0x0) {
      *(long *)local.super_object.super_handle.m_ptr =
           *(long *)local.super_object.super_handle.m_ptr + 1;
    }
    pybind11::eval<(pybind11::eval_mode)1>
              ((pybind11 *)&local_38,(str *)&local_118,&local_120,&local_128);
    pybind11::object::~object(&local_38);
    pybind11::object::~object(&local_128);
    pybind11::object::~object(&local_120);
    pybind11::object::~object(&local_118);
    pybind11::str::str((str *)&local_130,"print(\'Today is\', ctime(time()))");
    local_138.super_handle.m_ptr = (handle)(handle)global.super_object.super_handle.m_ptr;
    if ((handle)global.super_object.super_handle.m_ptr != (handle)0x0) {
      *(long *)global.super_object.super_handle.m_ptr =
           *(long *)global.super_object.super_handle.m_ptr + 1;
    }
    local_140.super_handle.m_ptr = (handle)(handle)local.super_object.super_handle.m_ptr;
    if ((handle)local.super_object.super_handle.m_ptr != (handle)0x0) {
      *(long *)local.super_object.super_handle.m_ptr =
           *(long *)local.super_object.super_handle.m_ptr + 1;
    }
    pybind11::eval<(pybind11::eval_mode)0>
              ((pybind11 *)&local_40,(str *)&local_130,&local_138,&local_140);
    pybind11::object::~object(&local_40);
    pybind11::object::~object(&local_140);
    pybind11::object::~object(&local_138);
    pybind11::object::~object(&local_130);
    func_02._0_4_ = 100;
    pybind11::detail::object_api<pybind11::handle>::operator[]
              (&func_01,(object_api<pybind11::handle> *)&local,"x");
    pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>::operator=
              (&func_01,(int *)&func_02);
    pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>::~accessor
              (&func_01);
    pybind11::str::str((str *)&local_148,"y = 200");
    local_150.super_handle.m_ptr = (handle)(handle)global.super_object.super_handle.m_ptr;
    if ((handle)global.super_object.super_handle.m_ptr != (handle)0x0) {
      *(long *)global.super_object.super_handle.m_ptr =
           *(long *)global.super_object.super_handle.m_ptr + 1;
    }
    local_158.super_handle.m_ptr = (handle)(handle)local.super_object.super_handle.m_ptr;
    if ((handle)local.super_object.super_handle.m_ptr != (handle)0x0) {
      *(long *)local.super_object.super_handle.m_ptr =
           *(long *)local.super_object.super_handle.m_ptr + 1;
    }
    pybind11::eval<(pybind11::eval_mode)1>
              ((pybind11 *)&local_48,(str *)&local_148,&local_150,&local_158);
    pybind11::object::~object(&local_48);
    pybind11::object::~object(&local_158);
    pybind11::object::~object(&local_150);
    pybind11::object::~object(&local_148);
    pybind11::str::str((str *)&local_160,"print(\'x + y =\', x + y)");
    local_168.super_handle.m_ptr = (handle)(handle)global.super_object.super_handle.m_ptr;
    if ((handle)global.super_object.super_handle.m_ptr != (handle)0x0) {
      *(long *)global.super_object.super_handle.m_ptr =
           *(long *)global.super_object.super_handle.m_ptr + 1;
    }
    local_170.super_handle.m_ptr = (handle)(handle)local.super_object.super_handle.m_ptr;
    if ((handle)local.super_object.super_handle.m_ptr != (handle)0x0) {
      *(long *)local.super_object.super_handle.m_ptr =
           *(long *)local.super_object.super_handle.m_ptr + 1;
    }
    pybind11::eval<(pybind11::eval_mode)0>
              ((pybind11 *)&local_50,(str *)&local_160,&local_168,&local_170);
    pybind11::object::~object(&local_50);
    pybind11::object::~object(&local_170);
    pybind11::object::~object(&local_168);
    pybind11::object::~object(&local_160);
    pybind11::str::str((str *)&local_178,"z = x + y");
    local_180.super_handle.m_ptr = (handle)(handle)global.super_object.super_handle.m_ptr;
    if ((handle)global.super_object.super_handle.m_ptr != (handle)0x0) {
      *(long *)global.super_object.super_handle.m_ptr =
           *(long *)global.super_object.super_handle.m_ptr + 1;
    }
    local_188.super_handle.m_ptr = (handle)(handle)local.super_object.super_handle.m_ptr;
    if ((handle)local.super_object.super_handle.m_ptr != (handle)0x0) {
      *(long *)local.super_object.super_handle.m_ptr =
           *(long *)local.super_object.super_handle.m_ptr + 1;
    }
    pybind11::eval<(pybind11::eval_mode)1>
              ((pybind11 *)&local_58,(str *)&local_178,&local_180,&local_188);
    pybind11::object::~object(&local_58);
    pybind11::object::~object(&local_188);
    pybind11::object::~object(&local_180);
    pybind11::object::~object(&local_178);
    pybind11::detail::object_api<pybind11::handle>::operator[]
              (&func_01,(object_api<pybind11::handle> *)&local,"z");
    iVar1 = pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>::cast<int>
                      (&func_01);
    pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>::~accessor
              (&func_01);
    poVar3 = std::operator<<((ostream *)&std::cout,"cpp: z = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    std::operator<<(poVar3,"\n");
    pybind11::str::str((str *)&local_190,"def func_01():\n\tprint(\'func_01: call\')\n");
    local_198.super_handle.m_ptr = (handle)(handle)global.super_object.super_handle.m_ptr;
    if ((handle)global.super_object.super_handle.m_ptr != (handle)0x0) {
      *(long *)global.super_object.super_handle.m_ptr =
           *(long *)global.super_object.super_handle.m_ptr + 1;
    }
    local_1a0.super_handle.m_ptr = (handle)(handle)local.super_object.super_handle.m_ptr;
    if ((handle)local.super_object.super_handle.m_ptr != (handle)0x0) {
      *(long *)local.super_object.super_handle.m_ptr =
           *(long *)local.super_object.super_handle.m_ptr + 1;
    }
    pybind11::eval<(pybind11::eval_mode)2>
              ((pybind11 *)&local_60,(str *)&local_190,&local_198,&local_1a0);
    pybind11::object::~object(&local_60);
    pybind11::object::~object(&local_1a0);
    pybind11::object::~object(&local_198);
    pybind11::object::~object(&local_190);
    pybind11::detail::object_api<pybind11::handle>::operator[]
              (&func_01,(object_api<pybind11::handle> *)&local,"func_01");
    pybind11::detail::
    object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>::
    operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>
                *)&local_68);
    pybind11::object::~object(&local_68);
    pybind11::str::str((str *)&local_1a8,
                       "def func_02(a, b):\n\tprint(\'func_02: {} + {} = {}\'.format(a, b, a + b))\n"
                      );
    local_1b0.super_handle.m_ptr = (handle)(handle)global.super_object.super_handle.m_ptr;
    if ((handle)global.super_object.super_handle.m_ptr != (handle)0x0) {
      *(long *)global.super_object.super_handle.m_ptr =
           *(long *)global.super_object.super_handle.m_ptr + 1;
    }
    local_1b8.super_handle.m_ptr = (handle)(handle)local.super_object.super_handle.m_ptr;
    if ((handle)local.super_object.super_handle.m_ptr != (handle)0x0) {
      *(long *)local.super_object.super_handle.m_ptr =
           *(long *)local.super_object.super_handle.m_ptr + 1;
    }
    pybind11::eval<(pybind11::eval_mode)2>
              ((pybind11 *)&local_70,(str *)&local_1a8,&local_1b0,&local_1b8);
    pybind11::object::~object(&local_70);
    pybind11::object::~object(&local_1b8);
    pybind11::object::~object(&local_1b0);
    pybind11::object::~object(&local_1a8);
    pybind11::detail::object_api<pybind11::handle>::operator[]
              (&func_02,(object_api<pybind11::handle> *)&local,"func_02");
    func_03._0_4_ = 0x7b;
    it.dict.m_ptr._0_4_ = 0x1c8;
    pybind11::detail::
    object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>::
    operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>
                *)&local_78,(int *)&func_02,(int *)&func_03);
    pybind11::object::~object(&local_78);
    pybind11::detail::
    object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>::
    operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>
                *)&local_80,(char (*) [4])&func_02,(char (*) [4])"abc");
    pybind11::object::~object(&local_80);
    pybind11::str::str((str *)&local_1c0,"def func_03(a, b):\n\treturn a + b\n");
    local_1c8.super_handle.m_ptr = (handle)(handle)global.super_object.super_handle.m_ptr;
    if ((handle)global.super_object.super_handle.m_ptr != (handle)0x0) {
      *(long *)global.super_object.super_handle.m_ptr =
           *(long *)global.super_object.super_handle.m_ptr + 1;
    }
    local_1d0.super_handle.m_ptr = (handle)(handle)local.super_object.super_handle.m_ptr;
    if ((handle)local.super_object.super_handle.m_ptr != (handle)0x0) {
      *(long *)local.super_object.super_handle.m_ptr =
           *(long *)local.super_object.super_handle.m_ptr + 1;
    }
    pybind11::eval<(pybind11::eval_mode)2>
              ((pybind11 *)&local_88,(str *)&local_1c0,&local_1c8,&local_1d0);
    pybind11::object::~object(&local_88);
    pybind11::object::~object(&local_1d0);
    pybind11::object::~object(&local_1c8);
    pybind11::object::~object(&local_1c0);
    pybind11::detail::object_api<pybind11::handle>::operator[]
              (&func_03,(object_api<pybind11::handle> *)&local,"func_03");
    it.dict.m_ptr._0_4_ = 0x7b;
    local_220.m_ptr._0_4_ = 0x1c8;
    pybind11::detail::
    object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>::
    operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>
                *)&result,(int *)&func_03,(int *)&it);
    poVar3 = std::operator<<((ostream *)&std::cout,"cpp: func_03 result ");
    pybind11::str::str((str *)&local_220,&result);
    pybind11::cast<std::__cxx11::string>
              ((enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
                *)&it,(pybind11 *)&local_220,object);
    poVar3 = std::operator<<(poVar3,(string *)&it);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&it);
    pybind11::object::~object((object *)&local_220);
    pybind11::object::~object(&result);
    pybind11::detail::
    object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>::
    operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>
                *)&result,(char (*) [4])&func_03,(char (*) [4])"abc");
    poVar3 = std::operator<<((ostream *)&std::cout,"cpp: func_03 result ");
    pybind11::str::str((str *)&local_220,&result);
    pybind11::cast<std::__cxx11::string>
              ((enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
                *)&it,(pybind11 *)&local_220,object_00);
    poVar3 = std::operator<<(poVar3,(string *)&it);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&it);
    pybind11::object::~object((object *)&local_220);
    pybind11::object::~object(&result);
    std::operator<<((ostream *)&std::cout,"\n\nAll local variable.\n");
    pybind11::dict::begin(&it,&local);
    while (it.pos != -1) {
      auVar4 = PyObject_Str(it.key.m_ptr);
      local_220.m_ptr = auVar4._0_8_;
      pybind11::cast<std::__cxx11::string>
                ((enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
                  *)&result,(pybind11 *)&local_220,auVar4._8_8_);
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)&result);
      std::operator<<(poVar3," : ");
      std::__cxx11::string::~string((string *)&result);
      pybind11::object::~object((object *)&local_220);
      auVar4 = PyObject_Str(it.value.m_ptr);
      local_220.m_ptr = auVar4._0_8_;
      pybind11::cast<std::__cxx11::string>
                ((enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
                  *)&result,(pybind11 *)&local_220,auVar4._8_8_);
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)&result);
      std::operator<<(poVar3," : ");
      std::__cxx11::string::~string((string *)&result);
      pybind11::object::~object((object *)&local_220);
      auVar4 = PyObject_Str((it.value.m_ptr)->ob_type);
      local_220.m_ptr = auVar4._0_8_;
      pybind11::cast<std::__cxx11::string>
                ((enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
                  *)&result,(pybind11 *)&local_220,auVar4._8_8_);
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)&result);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)&result);
      pybind11::object::~object((object *)&local_220);
      pybind11::detail::dict_iterator::operator++(&it);
    }
    pybind11::str::str((str *)&local_1f8,"sample01.py");
    local_200.super_handle.m_ptr = (handle)(handle)global.super_object.super_handle.m_ptr;
    if ((handle)global.super_object.super_handle.m_ptr != (handle)0x0) {
      *(long *)global.super_object.super_handle.m_ptr =
           *(long *)global.super_object.super_handle.m_ptr + 1;
    }
    local_208.super_handle.m_ptr = (handle)(handle)local.super_object.super_handle.m_ptr;
    if ((handle)local.super_object.super_handle.m_ptr != (handle)0x0) {
      *(long *)local.super_object.super_handle.m_ptr =
           *(long *)local.super_object.super_handle.m_ptr + 1;
    }
    pybind11::eval_file<(pybind11::eval_mode)2>
              ((pybind11 *)&local_90,(str *)&local_1f8,&local_200,&local_208);
    pybind11::object::~object(&local_90);
    pybind11::object::~object(&local_208);
    pybind11::object::~object(&local_200);
    pybind11::object::~object(&local_1f8);
    pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>::~accessor
              (&func_03);
    pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>::~accessor
              (&func_02);
    pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>::~accessor
              (&func_01);
    pybind11::object::~object(&local.super_object);
    pybind11::object::~object(&global.super_object);
    Py_Finalize();
    PyMem_RawFree(lVar2);
    return 0;
  }
  fwrite("Fatal error: cannot decode argv[0]\n",0x23,1,_stderr);
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
	wchar_t* program = Py_DecodeLocale(argv[0], nullptr);
	if (program == nullptr) {
		fprintf(stderr, "Fatal error: cannot decode argv[0]\n");
		exit(1);
	}
	Py_SetProgramName(program);
	Py_Initialize();

	try {
		auto global = py::dict(py::module::import("__main__").attr("__dict__"));
		auto local = py::dict();

		// http://docs.python.jp/3.5/extending/embedding.html のサンプルを
		// pybind11 で記述
		py::eval<py::eval_single_statement>(
			"from time import time,ctime", global, local);
		py::eval("print('Today is', ctime(time()))", global, local);

		// 変数の定義
		local["x"] = 100;
		py::eval<py::eval_single_statement>("y = 200", global, local);
		py::eval("print('x + y =', x + y)", global, local);

		// 値の取得
		py::eval<py::eval_single_statement>("z = x + y", global, local);
		auto z = local["z"].cast<int>();
		std::cout << "cpp: z = " << z << "\n";

		// 関数定義と呼び出し
		py::eval<py::eval_statements>(
			"def func_01():\n"
			"	print('func_01: call')\n",
			global, local);
		auto func_01 = local["func_01"];
		func_01();

		// 関数へ引数を渡す
		py::eval<py::eval_statements>(
			"def func_02(a, b):\n"
			"	print('func_02: {} + {} = {}'.format(a, b, a + b))\n",
			global, local);
		auto func_02 = local["func_02"];
		func_02(123, 456);
		func_02("abc", "efg");

		// 関数の戻り値を取得する
		py::eval<py::eval_statements>(
			"def func_03(a, b):\n"
			"	return a + b\n",
			global, local);
		auto func_03 = local["func_03"];
		{
			auto result = func_03(123, 456);
			std::cout << "cpp: func_03 result "
					  << py::str(result).cast<std::string>() << "\n";
		}
		{
			auto result = func_03("abc", "def");
			std::cout << "cpp: func_03 result "
					  << py::str(result).cast<std::string>() << "\n";
		}

		std::cout << "\n\nAll local variable.\n";
		for (auto it = local.begin(); it != local.end(); ++it) {
			std::cout << py::str((*it).first).cast<std::string>() << " : ";
			std::cout << py::str((*it).second).cast<std::string>() << " : ";
			std::cout << py::str((*it).second.get_type()).cast<std::string>()
					  << "\n";
		}

		py::eval_file("sample01.py", global, local);
	} catch (py::error_already_set& e) {
		std::cout << "Python error.\n" << e.what() << "\n";
	}

	Py_Finalize();
	PyMem_RawFree(program);

	return 0;
}